

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddMakefile
          (cmGlobalGenerator *this,unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *mf)

{
  cmake *pcVar1;
  bool bVar2;
  pointer mf_00;
  cmState *this_00;
  char *__nptr;
  size_type sVar3;
  float local_f4;
  allocator<char> local_a9;
  string local_a8;
  float local_84;
  int local_80;
  float prog;
  int numGen;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue numGenC;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *mf_local;
  cmGlobalGenerator *this_local;
  
  numGenC.Value = (string *)mf;
  mf_00 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(mf);
  IndexMakefile(this,mf_00);
  std::
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  ::push_back(&this->Makefiles,mf);
  this_00 = cmake::GetState(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_NUMBER_OF_MAKEFILES",&local_41);
  local_20 = cmState::GetInitializedCacheValue(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar2 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar2) {
    cmValue::operator->[abi_cxx11_(&local_20);
    __nptr = (char *)std::__cxx11::string::c_str();
    local_80 = atoi(__nptr);
    sVar3 = std::
            vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
            ::size(&this->Makefiles);
    local_f4 = (float)sVar3;
    local_84 = local_f4 / (float)local_80;
    if (1.0 < local_84) {
      local_84 = 1.0;
    }
    pcVar1 = this->CMakeInstance;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Configuring",&local_a9);
    cmake::UpdateProgress(pcVar1,&local_a8,local_84);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  else {
    this->FirstTimeProgress = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    if (0.95 < this->FirstTimeProgress) {
      this->FirstTimeProgress = 0.95;
    }
    pcVar1 = this->CMakeInstance;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&numGen,"Configuring",(allocator<char> *)((long)&prog + 3));
    cmake::UpdateProgress(pcVar1,(string *)&numGen,this->FirstTimeProgress);
    std::__cxx11::string::~string((string *)&numGen);
    std::allocator<char>::~allocator((allocator<char> *)((long)&prog + 3));
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddMakefile(std::unique_ptr<cmMakefile> mf)
{
  this->IndexMakefile(mf.get());
  this->Makefiles.push_back(std::move(mf));

  // update progress
  // estimate how many lg there will be
  cmValue numGenC = this->CMakeInstance->GetState()->GetInitializedCacheValue(
    "CMAKE_NUMBER_OF_MAKEFILES");

  if (!numGenC) {
    // If CMAKE_NUMBER_OF_MAKEFILES is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move half way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) / 30.0f);
    if (this->FirstTimeProgress > 0.95f) {
      this->FirstTimeProgress = 0.95f;
    }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
    return;
  }

  int numGen = atoi(numGenC->c_str());
  float prog =
    static_cast<float>(this->Makefiles.size()) / static_cast<float>(numGen);
  if (prog > 1.0f) {
    prog = 1.0f;
  }
  this->CMakeInstance->UpdateProgress("Configuring", prog);
}